

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.hpp
# Opt level: O1

void __thiscall msgpack::v1::sbuffer::expand_buffer(sbuffer *this,size_t len)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong __size;
  
  uVar2 = 0x2000;
  if (this->m_alloc != 0) {
    uVar2 = this->m_alloc * 2;
  }
  uVar5 = len + this->m_size;
  do {
    __size = uVar2;
    if (uVar5 <= uVar2) break;
    bVar1 = 0 < (long)uVar2;
    uVar2 = uVar2 * 2;
    __size = uVar5;
  } while (bVar1);
  pcVar3 = (char *)realloc(this->m_data,__size);
  if (pcVar3 != (char *)0x0) {
    this->m_data = pcVar3;
    this->m_alloc = __size;
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = __cxa_init_primary_exception;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void expand_buffer(size_t len)
    {
        size_t nsize = (m_alloc > 0) ?
                m_alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < m_size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = m_size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        void* tmp = ::realloc(m_data, nsize);
        if(!tmp) {
            throw std::bad_alloc();
        }

        m_data = static_cast<char*>(tmp);
        m_alloc = nsize;
    }